

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

String * __thiscall
nigel::Token_Comment::toString_abi_cxx11_
          (String *__return_storage_ptr__,Token_Comment *this,bool extended)

{
  char *__rhs;
  bool extended_local;
  Token_Comment *this_local;
  
  __rhs = "";
  if (extended) {
    __rhs = "\t\tas comment";
  }
  std::operator+(__return_storage_ptr__,&this->comment,__rhs);
  return __return_storage_ptr__;
}

Assistant:

String Token_Comment::toString( bool extended ) const
	{
		return comment + ( extended ? "\t\tas comment" : "" );
	}